

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O3

MTBDD mtbdd_set_remove(MTBDD set,uint32_t var)

{
  MTBDD high;
  long lVar1;
  MTBDD MVar2;
  uint var_00;
  bool bVar3;
  
  lVar1 = (set & 0xffffffffff) * 0x10;
  var_00 = (uint)((ulong)*(undefined8 *)(nodes->data + lVar1 + 8) >> 0x28);
  MVar2 = set;
  if (((var_00 <= var) &&
      (MVar2 = set & 0x8000000000000000 ^ *(ulong *)(nodes->data + lVar1) & 0x800000ffffffffff,
      var_00 != var)) &&
     (high = mtbdd_set_remove(MVar2,var), bVar3 = MVar2 != high, MVar2 = set, bVar3)) {
    if (high != 0) {
      MVar2 = _mtbdd_makenode(var_00,0,high);
      return MVar2;
    }
    MVar2 = 0;
  }
  return MVar2;
}

Assistant:

MTBDD
mtbdd_set_remove(MTBDD set, uint32_t var)
{
    if (set == mtbdd_true) return mtbdd_true;

    mtbddnode_t set_node = MTBDD_GETNODE(set);
    uint32_t set_var = mtbddnode_getvariable(set_node);
    if (var < set_var) return set;
    else if (set_var == var) return mtbddnode_followhigh(set, set_node);
    else {
        MTBDD sub = mtbddnode_followhigh(set, set_node);
        MTBDD res = mtbdd_set_remove(sub, var);
        res = sub == res ? set : mtbdd_makenode(set_var, mtbdd_false, res);
        return res;
    }
}